

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcsample.c
# Opt level: O1

void jinit_downsampler(j_compress_ptr cinfo)

{
  int iVar1;
  int iVar2;
  jpeg_error_mgr *pjVar3;
  bool bVar4;
  jpeg_downsampler *pjVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  undefined1 auVar10 [16];
  
  auVar10 = (undefined1  [16])(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xa8);
  pjVar5 = auVar10._0_8_;
  cinfo->downsample = pjVar5;
  pjVar5->start_pass = start_pass_downsample;
  pjVar5->downsample = sep_downsample;
  pjVar5->need_context_rows = 0;
  if (cinfo->CCIR601_sampling != 0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x1a;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->num_components < 1) {
    bVar4 = true;
  }
  else {
    piVar9 = &cinfo->comp_info->DCT_v_scaled_size;
    bVar4 = true;
    lVar8 = 0;
    do {
      iVar7 = (piVar9[-1] * piVar9[-8]) / cinfo->min_DCT_h_scaled_size;
      iVar6 = (*piVar9 * piVar9[-7]) / cinfo->min_DCT_v_scaled_size;
      iVar1 = cinfo->max_h_samp_factor;
      iVar2 = cinfo->max_v_samp_factor;
      *(int *)((long)&pjVar5[4].downsample + lVar8 * 4) = iVar6;
      if ((iVar1 == iVar7) && (iVar2 == iVar6)) {
        if (cinfo->smoothing_factor == 0) {
          (&pjVar5[1].start_pass)[lVar8] = fullsize_downsample;
        }
        else {
          (&pjVar5[1].start_pass)[lVar8] = fullsize_smooth_downsample;
LAB_0010f8d9:
          pjVar5->need_context_rows = 1;
        }
      }
      else if ((iVar1 == iVar7 * 2) && (iVar2 == iVar6)) {
        (&pjVar5[1].start_pass)[lVar8] = h2v1_downsample;
LAB_0010f8f3:
        bVar4 = false;
      }
      else if ((iVar1 == iVar7 * 2) && (iVar2 == iVar6 * 2)) {
        if (cinfo->smoothing_factor != 0) {
          (&pjVar5[1].start_pass)[lVar8] = h2v2_smooth_downsample;
          goto LAB_0010f8d9;
        }
        (&pjVar5[1].start_pass)[lVar8] = h2v2_downsample;
      }
      else {
        if (iVar1 % iVar7 == 0) {
          if (iVar2 % iVar6 == 0) {
            (&pjVar5[1].start_pass)[lVar8] = int_downsample;
            *(char *)((long)&pjVar5[6].start_pass + lVar8) = (char)(iVar1 / iVar7);
            *(char *)((long)&pjVar5[6].downsample + lVar8 + 2) = (char)(iVar2 / iVar6);
            goto LAB_0010f8f3;
          }
        }
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x27;
        (*pjVar3->error_exit)((j_common_ptr)cinfo);
      }
      lVar8 = lVar8 + 1;
      piVar9 = piVar9 + 0x18;
    } while (lVar8 < cinfo->num_components);
  }
  if (cinfo->smoothing_factor != 0 && !bVar4) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x65;
    (*pjVar3->emit_message)((j_common_ptr)cinfo,0);
    return;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_downsampler (j_compress_ptr cinfo)
{
  my_downsample_ptr downsample;
  int ci;
  jpeg_component_info * compptr;
  boolean smoothok = TRUE;
  int h_in_group, v_in_group, h_out_group, v_out_group;

  downsample = (my_downsample_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_downsampler));
  cinfo->downsample = (struct jpeg_downsampler *) downsample;
  downsample->pub.start_pass = start_pass_downsample;
  downsample->pub.downsample = sep_downsample;
  downsample->pub.need_context_rows = FALSE;

  if (cinfo->CCIR601_sampling)
    ERREXIT(cinfo, JERR_CCIR601_NOTIMPL);

  /* Verify we can handle the sampling factors, and set up method pointers */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Compute size of an "output group" for DCT scaling.  This many samples
     * are to be converted from max_h_samp_factor * max_v_samp_factor pixels.
     */
    h_out_group = (compptr->h_samp_factor * compptr->DCT_h_scaled_size) /
		  cinfo->min_DCT_h_scaled_size;
    v_out_group = (compptr->v_samp_factor * compptr->DCT_v_scaled_size) /
		  cinfo->min_DCT_v_scaled_size;
    h_in_group = cinfo->max_h_samp_factor;
    v_in_group = cinfo->max_v_samp_factor;
    downsample->rowgroup_height[ci] = v_out_group; /* save for use later */
    if (h_in_group == h_out_group && v_in_group == v_out_group) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = fullsize_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = fullsize_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group) {
      smoothok = FALSE;
      downsample->methods[ci] = h2v1_downsample;
    } else if (h_in_group == h_out_group * 2 &&
	       v_in_group == v_out_group * 2) {
#ifdef INPUT_SMOOTHING_SUPPORTED
      if (cinfo->smoothing_factor) {
	downsample->methods[ci] = h2v2_smooth_downsample;
	downsample->pub.need_context_rows = TRUE;
      } else
#endif
	downsample->methods[ci] = h2v2_downsample;
    } else if ((h_in_group % h_out_group) == 0 &&
	       (v_in_group % v_out_group) == 0) {
      smoothok = FALSE;
      downsample->methods[ci] = int_downsample;
      downsample->h_expand[ci] = (UINT8) (h_in_group / h_out_group);
      downsample->v_expand[ci] = (UINT8) (v_in_group / v_out_group);
    } else
      ERREXIT(cinfo, JERR_FRACT_SAMPLE_NOTIMPL);
  }

#ifdef INPUT_SMOOTHING_SUPPORTED
  if (cinfo->smoothing_factor && !smoothok)
    TRACEMS(cinfo, 0, JTRC_SMOOTH_NOTIMPL);
#endif
}